

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

bool __thiscall
math::wide_integer::uintwide_t<512u,unsigned_int,void,false>::wr_string<char*>
          (uintwide_t<512u,unsigned_int,void,false> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  char cVar1;
  unsigned_fast_type uVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  size_type_conflict sVar6;
  uint uVar7;
  const_iterator puVar8;
  byte *pbVar9;
  reference pcVar10;
  size_type sVar11;
  pointer pcVar12;
  uintwide_t<24U,_unsigned_char,_void,_false> *v;
  reference pcVar13;
  pointer pcVar14;
  reference pcVar15;
  pointer pcVar16;
  char local_421;
  unsigned_long local_3c8;
  unsigned_fast_type local_3c0;
  unsigned_fast_type dst;
  signed_fast_type pos_2;
  string_storage_hex_type str_temp_2;
  uintwide_t<24U,_unsigned_char,_void,_false> t_2;
  unsigned_long local_2e8;
  uintwide_t<512U,_unsigned_int,_void,_false> local_2e0;
  wide_integer local_2a0 [64];
  uintwide_t<24U,_unsigned_char,_void,_false> local_260 [2];
  uintwide_t<24U,_unsigned_char,_void,_false> tmp;
  ulong local_220;
  signed_fast_type pos_1;
  string_storage_dec_type str_temp_1;
  bool str_has_neg_sign;
  uintwide_t<24U,_unsigned_char,_void,_false> t_1;
  unsigned_long local_130;
  byte local_121;
  ulong uStack_120;
  char c;
  signed_fast_type pos;
  string_storage_oct_type str_temp;
  limb_type mask;
  uintwide_t<24U,_unsigned_char,_void,_false> t;
  bool local_1d;
  bool wr_string_is_ok;
  bool is_uppercase_local;
  bool show_pos_local;
  bool show_base_local;
  uint_fast8_t base_rep_local;
  char *str_result_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  local_1d = true;
  if (base_rep == '\b') {
    memcpy(str_temp.super_array<char,_179UL>.elems + 0xaf,this,0x40);
    str_temp.super_array<char,_179UL>.elems[0xab] = '\a';
    str_temp.super_array<char,_179UL>.elems[0xac] = '\0';
    str_temp.super_array<char,_179UL>.elems[0xad] = '\0';
    str_temp.super_array<char,_179UL>.elems[0xae] = '\0';
    memset((void *)((long)&pos + 1),0,0xb3);
    detail::fixed_static_array<char,_179U>::fixed_static_array
              ((fixed_static_array<char,_179U> *)((long)&pos + 1));
    sVar6 = detail::fixed_static_array<char,_179U>::static_size();
    uStack_120 = (ulong)(sVar6 - 1);
    bVar5 = uintwide_t<512U,_unsigned_int,_void,_false>::is_zero
                      ((uintwide_t<512U,_unsigned_int,_void,_false> *)
                       (str_temp.super_array<char,_179UL>.elems + 0xaf));
    if (bVar5) {
      uStack_120 = uStack_120 - 1;
      pcVar10 = detail::fixed_static_array<char,_179U>::operator[]
                          ((fixed_static_array<char,_179U> *)((long)&pos + 1),
                           (size_type_conflict)uStack_120);
      *pcVar10 = '0';
    }
    else {
      while (bVar5 = uintwide_t<512U,_unsigned_int,_void,_false>::is_zero
                               ((uintwide_t<512U,_unsigned_int,_void,_false> *)
                                (str_temp.super_array<char,_179UL>.elems + 0xaf)),
            !bVar5 && 0 < (long)uStack_120) {
        puVar8 = detail::array_detail::array<unsigned_int,_16UL>::cbegin
                           ((array<unsigned_int,_16UL> *)
                            (str_temp.super_array<char,_179UL>.elems + 0xaf));
        local_121 = (byte)*puVar8 & 7;
        if (local_121 < 9) {
          local_121 = local_121 + 0x30;
        }
        bVar3 = local_121;
        uStack_120 = uStack_120 - 1;
        pbVar9 = (byte *)detail::fixed_static_array<char,_179U>::operator[]
                                   ((fixed_static_array<char,_179U> *)((long)&pos + 1),
                                    (size_type_conflict)uStack_120);
        *pbVar9 = bVar3;
        operator>>=((uintwide_t<512u,unsigned_int,void,false> *)
                    (str_temp.super_array<char,_179UL>.elems + 0xaf),3);
      }
    }
    if ((show_base) && (0 < (long)uStack_120)) {
      uStack_120 = uStack_120 - 1;
      pcVar10 = detail::fixed_static_array<char,_179U>::operator[]
                          ((fixed_static_array<char,_179U> *)((long)&pos + 1),
                           (size_type_conflict)uStack_120);
      *pcVar10 = '0';
    }
    if ((show_pos) && (0 < (long)uStack_120)) {
      uStack_120 = uStack_120 - 1;
      pcVar10 = detail::fixed_static_array<char,_179U>::operator[]
                          ((fixed_static_array<char,_179U> *)((long)&pos + 1),
                           (size_type_conflict)uStack_120);
      *pcVar10 = '+';
    }
    if (field_width != 0) {
      sVar11 = detail::array_detail::array<char,_179UL>::size();
      local_130 = sVar11 - 1;
      field_width = detail::min_unsafe<unsigned_long>(&field_width,&local_130);
      while (uVar4 = uStack_120, sVar11 = detail::array_detail::array<char,_179UL>::size(),
            cVar1 = fill_char_str, (long)((sVar11 - 1) - field_width) < (long)uVar4) {
        uStack_120 = uStack_120 - 1;
        pcVar10 = detail::fixed_static_array<char,_179U>::operator[]
                            ((fixed_static_array<char,_179U> *)((long)&pos + 1),
                             (size_type_conflict)uStack_120);
        *pcVar10 = cVar1;
      }
    }
    sVar11 = detail::array_detail::array<char,_179UL>::size();
    pcVar10 = detail::fixed_static_array<char,_179U>::operator[]
                        ((fixed_static_array<char,_179U> *)((long)&pos + 1),(int)sVar11 - 1);
    *pcVar10 = '\0';
    pcVar12 = detail::array_detail::array<char,_179UL>::data((array<char,_179UL> *)((long)&pos + 1))
    ;
    detail::strcpy_unsafe<char*,char*>(str_result,pcVar12 + uStack_120);
  }
  else if (base_rep == '\n') {
    memcpy(str_temp_1.super_array<char,_164UL>.elems + 0x9d,this,0x40);
    str_temp_1.super_array<char,_164UL>.elems[0x9c] = '\0';
    memset((void *)((long)&pos_1 + 3),0,0xa4);
    detail::fixed_static_array<char,_164U>::fixed_static_array
              ((fixed_static_array<char,_164U> *)((long)&pos_1 + 3));
    sVar6 = detail::fixed_static_array<char,_164U>::static_size();
    local_220 = (ulong)(sVar6 - 1);
    bVar5 = uintwide_t<512U,_unsigned_int,_void,_false>::is_zero
                      ((uintwide_t<512U,_unsigned_int,_void,_false> *)
                       (str_temp_1.super_array<char,_164UL>.elems + 0x9d));
    if (bVar5) {
      local_220 = local_220 - 1;
      pcVar13 = detail::fixed_static_array<char,_164U>::operator[]
                          ((fixed_static_array<char,_164U> *)((long)&pos_1 + 3),
                           (size_type_conflict)local_220);
      *pcVar13 = '0';
    }
    else {
      while (bVar5 = uintwide_t<512U,_unsigned_int,_void,_false>::is_zero
                               ((uintwide_t<512U,_unsigned_int,_void,_false> *)
                                (str_temp_1.super_array<char,_164UL>.elems + 0x9d)),
            !bVar5 && 0 < (long)local_220) {
        memcpy(local_260,str_temp_1.super_array<char,_164UL>.elems + 0x9d,0x40);
        uintwide_t<512U,_unsigned_int,_void,_false>::eval_divide_by_single_limb
                  ((uintwide_t<512U,_unsigned_int,_void,_false> *)
                   (str_temp_1.super_array<char,_164UL>.elems + 0x9d),10,0,
                   (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0);
        memcpy(&local_2e0,str_temp_1.super_array<char,_164UL>.elems + 0x9d,0x40);
        v = uintwide_t<512U,_unsigned_int,_void,_false>::mul_by_limb(&local_2e0,10);
        wide_integer::operator-(local_2a0,local_260,v);
        uVar7 = wide_integer::uintwide_t::operator_cast_to_unsigned_int((uintwide_t *)local_2a0);
        local_220 = local_220 - 1;
        pcVar13 = detail::fixed_static_array<char,_164U>::operator[]
                            ((fixed_static_array<char,_164U> *)((long)&pos_1 + 3),
                             (size_type_conflict)local_220);
        *pcVar13 = (char)uVar7 + '0';
      }
    }
    if ((0 < (long)local_220) && (show_pos)) {
      local_220 = local_220 - 1;
      pcVar13 = detail::fixed_static_array<char,_164U>::operator[]
                          ((fixed_static_array<char,_164U> *)((long)&pos_1 + 3),
                           (size_type_conflict)local_220);
      *pcVar13 = '+';
    }
    if (field_width != 0) {
      sVar11 = detail::array_detail::array<char,_164UL>::size();
      local_2e8 = sVar11 - 1;
      field_width = detail::min_unsafe<unsigned_long>(&field_width,&local_2e8);
      while (sVar11 = detail::array_detail::array<char,_164UL>::size(), cVar1 = fill_char_str,
            (long)((sVar11 - 1) - field_width) < (long)local_220) {
        local_220 = local_220 - 1;
        pcVar13 = detail::fixed_static_array<char,_164U>::operator[]
                            ((fixed_static_array<char,_164U> *)((long)&pos_1 + 3),
                             (size_type_conflict)local_220);
        *pcVar13 = cVar1;
      }
    }
    sVar11 = detail::array_detail::array<char,_164UL>::size();
    pcVar13 = detail::fixed_static_array<char,_164U>::operator[]
                        ((fixed_static_array<char,_164U> *)((long)&pos_1 + 3),(int)sVar11 - 1);
    *pcVar13 = '\0';
    pcVar14 = detail::array_detail::array<char,_164UL>::data
                        ((array<char,_164UL> *)((long)&pos_1 + 3));
    detail::strcpy_unsafe<char*,char*>(str_result,pcVar14 + local_220);
  }
  else if (base_rep == '\x10') {
    memcpy(str_temp_2.super_array<char,_136UL>.elems + 0x80,this,0x40);
    memset(&pos_2,0,0x88);
    detail::fixed_static_array<char,_136U>::fixed_static_array
              ((fixed_static_array<char,_136U> *)&pos_2);
    sVar6 = detail::fixed_static_array<char,_136U>::static_size();
    dst = (unsigned_fast_type)(sVar6 - 1);
    bVar5 = uintwide_t<512U,_unsigned_int,_void,_false>::is_zero
                      ((uintwide_t<512U,_unsigned_int,_void,_false> *)
                       (str_temp_2.super_array<char,_136UL>.elems + 0x80));
    if (bVar5) {
      dst = dst - 1;
      pcVar15 = detail::fixed_static_array<char,_136U>::operator[]
                          ((fixed_static_array<char,_136U> *)&pos_2,(size_type_conflict)dst);
      *pcVar15 = '0';
    }
    else {
      pcVar15 = detail::fixed_static_array<char,_136U>::operator[]
                          ((fixed_static_array<char,_136U> *)&pos_2,(size_type_conflict)dst);
      local_3c0 = uintwide_t<512U,_unsigned_int,_void,_false>::extract_hex_digits<false,_nullptr>
                            ((uintwide_t<24U,_unsigned_char,_void,_false> *)
                             (str_temp_2.super_array<char,_136UL>.elems + 0x80),pcVar15,is_uppercase
                            );
      dst = dst - local_3c0;
    }
    if ((show_base) && (1 < (long)dst)) {
      local_421 = 'X';
      if (!is_uppercase) {
        local_421 = 'x';
      }
      dst = dst - 1;
      pcVar15 = detail::fixed_static_array<char,_136U>::operator[]
                          ((fixed_static_array<char,_136U> *)&pos_2,(size_type_conflict)dst);
      *pcVar15 = local_421;
      dst = dst - 1;
      pcVar15 = detail::fixed_static_array<char,_136U>::operator[]
                          ((fixed_static_array<char,_136U> *)&pos_2,(size_type_conflict)dst);
      *pcVar15 = '0';
    }
    if ((show_pos) && (0 < (long)dst)) {
      dst = dst - 1;
      pcVar15 = detail::fixed_static_array<char,_136U>::operator[]
                          ((fixed_static_array<char,_136U> *)&pos_2,(size_type_conflict)dst);
      *pcVar15 = '+';
    }
    if (field_width != 0) {
      sVar11 = detail::array_detail::array<char,_136UL>::size();
      local_3c8 = sVar11 - 1;
      field_width = detail::min_unsafe<unsigned_long>(&field_width,&local_3c8);
      while (uVar2 = dst, sVar11 = detail::array_detail::array<char,_136UL>::size(),
            cVar1 = fill_char_str, (long)((sVar11 - 1) - field_width) < (long)uVar2) {
        dst = dst - 1;
        pcVar15 = detail::fixed_static_array<char,_136U>::operator[]
                            ((fixed_static_array<char,_136U> *)&pos_2,(size_type_conflict)dst);
        *pcVar15 = cVar1;
      }
    }
    sVar11 = detail::array_detail::array<char,_136UL>::size();
    pcVar15 = detail::fixed_static_array<char,_136U>::operator[]
                        ((fixed_static_array<char,_136U> *)&pos_2,(int)sVar11 - 1);
    *pcVar15 = '\0';
    pcVar16 = detail::array_detail::array<char,_136UL>::data((array<char,_136UL> *)&pos_2);
    detail::strcpy_unsafe<char*,char*>(str_result,pcVar16 + dst);
  }
  else {
    local_1d = false;
  }
  return local_1d;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }